

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void dsfmt_fill_array_close_open(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  w128_t wVar4;
  w128_t wVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  w128_t *pwVar15;
  ulong uVar16;
  w128_t *pwVar17;
  bool bVar18;
  w128_t local_48;
  w128_t *local_38;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x21e,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
  }
  if (0x17d < size) {
    local_38 = dsfmt->status + 0xbf;
    local_48.u[0] = dsfmt->status[0xbf].u[0];
    local_48.u[1] = *(uint64_t *)((long)dsfmt->status + 0xbf8);
    do_recursion((w128_t *)array,dsfmt->status,dsfmt->status + 0x75,&local_48);
    pwVar17 = dsfmt->status + 0x76;
    for (lVar14 = 0; lVar14 != 0x490; lVar14 = lVar14 + 0x10) {
      do_recursion((w128_t *)((long)array + lVar14 + 0x10),pwVar17 + -0x75,pwVar17,&local_48);
      pwVar17 = pwVar17 + 1;
    }
    pwVar17 = dsfmt->status + 0x4a;
    lVar14 = 0x75;
    pwVar15 = (w128_t *)array;
    while (bVar18 = lVar14 != 0, lVar14 = lVar14 + -1, bVar18) {
      do_recursion(pwVar15 + 0x4a,pwVar17,pwVar15,&local_48);
      pwVar17 = pwVar17 + 1;
      pwVar15 = pwVar15 + 1;
    }
    uVar10 = (uint)size >> 1;
    pwVar17 = (w128_t *)array;
    for (uVar16 = 0xbf; (long)uVar16 < (long)(int)(uVar10 - 0xbf); uVar16 = uVar16 + 1) {
      do_recursion(pwVar17 + 0xbf,pwVar17,pwVar17 + 0x75,&local_48);
      wVar4.u32[2] = SUB84(pwVar17->d[1] + -1.0,0);
      wVar4.d[0] = pwVar17->d[0] + -1.0;
      wVar4.u32[3] = (int)((ulong)(pwVar17->d[1] + -1.0) >> 0x20);
      *pwVar17 = wVar4;
      pwVar17 = pwVar17 + 1;
    }
    uVar13 = 0;
    uVar11 = (ulong)(0x17e - uVar10);
    if ((int)(0x17e - uVar10) < 1) {
      uVar11 = uVar13;
    }
    lVar14 = (ulong)uVar10 * 0x10;
    for (; uVar11 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
      puVar1 = (undefined8 *)((long)array + uVar13 + lVar14 + -0xbf0);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + uVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
    }
    pwVar15 = dsfmt->status + uVar11;
    for (; uVar16 < uVar10; uVar16 = uVar16 + 1) {
      do_recursion(pwVar17 + 0xbf,pwVar17,pwVar17 + 0x75,&local_48);
      uVar9 = *(uint64_t *)((long)pwVar17 + 0xbf8);
      pwVar15->u[0] = pwVar17[0xbf].u[0];
      pwVar15->u[1] = uVar9;
      wVar5.u32[2] = SUB84(pwVar17->d[1] + -1.0,0);
      wVar5.d[0] = pwVar17->d[0] + -1.0;
      wVar5.u32[3] = (int)((ulong)(pwVar17->d[1] + -1.0) >> 0x20);
      *pwVar17 = wVar5;
      pwVar15 = (w128_t *)(pwVar15->u + 2);
      pwVar17 = pwVar17 + 1;
    }
    for (lVar12 = -0xbf0; lVar12 != 0; lVar12 = lVar12 + 0x10) {
      pdVar3 = (double *)((long)array + lVar12 + lVar14);
      dVar7 = pdVar3[1] + -1.0;
      auVar6._8_4_ = SUB84(dVar7,0);
      auVar6._0_8_ = *pdVar3 + -1.0;
      auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
      *(undefined1 (*) [16])((long)array + lVar12 + lVar14) = auVar6;
    }
    local_38->u[0] = local_48.u[0];
    local_38->u[1] = local_48.u[1];
    return;
  }
  __assert_fail("size >= DSFMT_N64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                ,0x21f,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
}

Assistant:

void dsfmt_fill_array_close_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c0o1(dsfmt, (w128_t *)array, size / 2);
}